

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_PhysicallyBasedMaterialUserData::Parameters::IsValid(Parameters *this,ON_TextLog *text_log)

{
  bool bVar1;
  ON_TextLog *text_log_local;
  Parameters *this_local;
  
  if ((this->subsurface != -1.23432101234321e+308) || (NAN(this->subsurface))) {
    bVar1 = ON_4fColor::IsValid(&this->subsurface_scattering_color,(ON_TextLog *)0x0);
    if (bVar1) {
      if (((this->subsurface_scattering_radius == -1.23432101234321e+308) &&
          (!NAN(this->subsurface_scattering_radius))) ||
         ((this->subsurface_scattering_radius == 1.23432101234321e+308 &&
          (!NAN(this->subsurface_scattering_radius))))) {
        this_local._7_1_ = false;
      }
      else if (((this->metallic == -1.23432101234321e+308) && (!NAN(this->metallic))) ||
              ((this->metallic == 1.23432101234321e+308 && (!NAN(this->metallic))))) {
        this_local._7_1_ = false;
      }
      else if (((this->specular == -1.23432101234321e+308) && (!NAN(this->specular))) ||
              ((this->specular == 1.23432101234321e+308 && (!NAN(this->specular))))) {
        this_local._7_1_ = false;
      }
      else if (((this->specular_tint == -1.23432101234321e+308) && (!NAN(this->specular_tint))) ||
              ((this->specular_tint == 1.23432101234321e+308 && (!NAN(this->specular_tint))))) {
        this_local._7_1_ = false;
      }
      else if (((this->roughness == -1.23432101234321e+308) && (!NAN(this->roughness))) ||
              ((this->roughness == 1.23432101234321e+308 && (!NAN(this->roughness))))) {
        this_local._7_1_ = false;
      }
      else if (((this->anisotropic == -1.23432101234321e+308) && (!NAN(this->anisotropic))) ||
              ((this->anisotropic == 1.23432101234321e+308 && (!NAN(this->anisotropic))))) {
        this_local._7_1_ = false;
      }
      else if (((this->anisotropic_rotation == -1.23432101234321e+308) &&
               (!NAN(this->anisotropic_rotation))) ||
              ((this->anisotropic_rotation == 1.23432101234321e+308 &&
               (!NAN(this->anisotropic_rotation))))) {
        this_local._7_1_ = false;
      }
      else if (((this->sheen == -1.23432101234321e+308) && (!NAN(this->sheen))) ||
              ((this->sheen == 1.23432101234321e+308 && (!NAN(this->sheen))))) {
        this_local._7_1_ = false;
      }
      else if (((this->sheen_tint == -1.23432101234321e+308) && (!NAN(this->sheen_tint))) ||
              ((this->sheen_tint == 1.23432101234321e+308 && (!NAN(this->sheen_tint))))) {
        this_local._7_1_ = false;
      }
      else if (((this->clearcoat == -1.23432101234321e+308) && (!NAN(this->clearcoat))) ||
              ((this->clearcoat == 1.23432101234321e+308 && (!NAN(this->clearcoat))))) {
        this_local._7_1_ = false;
      }
      else if (((this->clearcoat_roughness == -1.23432101234321e+308) &&
               (!NAN(this->clearcoat_roughness))) ||
              ((this->clearcoat_roughness == 1.23432101234321e+308 &&
               (!NAN(this->clearcoat_roughness))))) {
        this_local._7_1_ = false;
      }
      else if (((this->opacity_IOR == -1.23432101234321e+308) && (!NAN(this->opacity_IOR))) ||
              ((this->opacity_IOR == 1.23432101234321e+308 && (!NAN(this->opacity_IOR))))) {
        this_local._7_1_ = false;
      }
      else if (((this->opacity == -1.23432101234321e+308) && (!NAN(this->opacity))) ||
              ((this->opacity == 1.23432101234321e+308 && (!NAN(this->opacity))))) {
        this_local._7_1_ = false;
      }
      else if (((this->opacity_roughness == -1.23432101234321e+308) &&
               (!NAN(this->opacity_roughness))) ||
              ((this->opacity_roughness == 1.23432101234321e+308 && (!NAN(this->opacity_roughness)))
              )) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = ON_4fColor::IsValid(&this->emission,(ON_TextLog *)0x0);
        if (bVar1) {
          if (((this->alpha == -1.23432101234321e+308) && (!NAN(this->alpha))) ||
             ((this->alpha == 1.23432101234321e+308 && (!NAN(this->alpha))))) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool IsValid(class ON_TextLog* text_log = nullptr) const
    {
      //!base_color.IsValid() means that PBR is not supported.
      //if (!base_color.IsValid()) return false;
      if (ON_UNSET_VALUE == subsurface) return false;
      if (!subsurface_scattering_color.IsValid()) return false;
      if (ON_IS_UNSET_DOUBLE(subsurface_scattering_radius)) return false;
      if (ON_IS_UNSET_DOUBLE(metallic)) return false;
      if (ON_IS_UNSET_DOUBLE(specular)) return false;
      if (ON_IS_UNSET_DOUBLE(specular_tint)) return false;
      if (ON_IS_UNSET_DOUBLE(roughness)) return false;
      if (ON_IS_UNSET_DOUBLE(anisotropic)) return false;
      if (ON_IS_UNSET_DOUBLE(anisotropic_rotation)) return false;
      if (ON_IS_UNSET_DOUBLE(sheen)) return false;
      if (ON_IS_UNSET_DOUBLE(sheen_tint)) return false;
      if (ON_IS_UNSET_DOUBLE(clearcoat)) return false;
      if (ON_IS_UNSET_DOUBLE(clearcoat_roughness)) return false;
      if (ON_IS_UNSET_DOUBLE(opacity_IOR)) return false;
      if (ON_IS_UNSET_DOUBLE(opacity)) return false;
      if (ON_IS_UNSET_DOUBLE(opacity_roughness)) return false;
      if (!emission.IsValid()) return false;
      if (ON_IS_UNSET_DOUBLE(alpha)) return false;

      return true;
    }